

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_mixVecVecScalar_vec2(ShaderEvalContext *c)

{
  float fVar1;
  undefined8 uVar2;
  
  fVar1 = c->in[2].m_data[1];
  uVar2 = *(undefined8 *)c->in[1].m_data;
  *(ulong *)((c->color).m_data + 1) =
       CONCAT44((1.0 - fVar1) * c->in[0].m_data[1] + fVar1 * (float)uVar2,
                (1.0 - fVar1) * c->in[0].m_data[3] + fVar1 * (float)((ulong)uVar2 >> 0x20));
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }